

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int bitstream_r_memcpy(bitstream_r *stream,void *dst,size_t bytes)

{
  ulong uVar1;
  size_t offset;
  uint8_t *buffer;
  size_t bytes_local;
  void *dst_local;
  bitstream_r *stream_local;
  
  bitstream_r_pad(stream);
  uVar1 = stream->bit_offset >> 3;
  if (stream->length < uVar1 + bytes) {
    stream_local._4_4_ = -1;
  }
  else {
    memcpy(dst,(void *)((long)stream->ptr + uVar1),bytes);
    stream->bit_offset = bytes * 8 + stream->bit_offset;
    stream_local._4_4_ = 0;
  }
  return stream_local._4_4_;
}

Assistant:

int
bitstream_r_memcpy(struct bitstream_r *stream, void *dst, size_t bytes) {
  const uint8_t *buffer;
  size_t offset;
  bitstream_r_pad(stream);

  offset = stream->bit_offset / 8;
  if (offset + bytes > stream->length) {
    return -1;
  }

  buffer = stream->ptr;
  memcpy(dst, &buffer[offset], bytes);

  stream->bit_offset += bytes * 8;
  return 0;
}